

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * AddWindowSettings(char *name)

{
  ImU32 IVar1;
  ImVector<ImGuiWindowSettings> *this;
  value_type *pvVar2;
  char *pcVar3;
  ImGuiWindowSettings *settings;
  ImGuiContext *local_18;
  ImGuiContext *g;
  char *name_local;
  
  local_18 = GImGui;
  this = &GImGui->SettingsWindows;
  g = (ImGuiContext *)name;
  ImGuiWindowSettings::ImGuiWindowSettings((ImGuiWindowSettings *)&settings);
  ImVector<ImGuiWindowSettings>::push_back(this,(value_type *)&settings);
  pvVar2 = ImVector<ImGuiWindowSettings>::back(&local_18->SettingsWindows);
  pcVar3 = ImStrdup(&g->Initialized);
  pvVar2->Name = pcVar3;
  IVar1 = ImHash(g,0,0);
  pvVar2->Id = IVar1;
  return pvVar2;
}

Assistant:

static ImGuiWindowSettings* AddWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->Id = ImHash(name, 0);
    return settings;
}